

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

U32 ZSTD_rawLiteralsCost(BYTE *literals,U32 litLength,optState_t *optPtr,int optLevel)

{
  int iVar1;
  uint uVar2;
  uint local_40;
  uint local_3c;
  uint local_38;
  U32 litPrice;
  U32 u;
  U32 litPriceMax;
  U32 price;
  int optLevel_local;
  optState_t *optPtr_local;
  U32 litLength_local;
  BYTE *literals_local;
  
  if (litLength == 0) {
    literals_local._4_4_ = 0;
  }
  else {
    iVar1 = ZSTD_compressedLiterals(optPtr);
    if (iVar1 == 0) {
      literals_local._4_4_ = litLength << 0xb;
    }
    else if (optPtr->priceType == zop_predef) {
      literals_local._4_4_ = litLength * 0x600;
    }
    else {
      u = optPtr->litSumBasePrice * litLength;
      uVar2 = optPtr->litSumBasePrice - 0x100;
      if (optPtr->litSumBasePrice < 0x100) {
        __assert_fail("optPtr->litSumBasePrice >= BITCOST_MULTIPLIER",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x117,
                      "U32 ZSTD_rawLiteralsCost(const BYTE *const, const U32, const optState_t *const, int)"
                     );
      }
      for (local_38 = 0; local_38 < litLength; local_38 = local_38 + 1) {
        if (optLevel == 0) {
          local_40 = ZSTD_bitWeight(optPtr->litFreq[literals[local_38]]);
        }
        else {
          local_40 = ZSTD_fracWeight(optPtr->litFreq[literals[local_38]]);
        }
        local_3c = local_40;
        if (uVar2 < local_40) {
          local_3c = uVar2;
        }
        u = u - local_3c;
      }
      literals_local._4_4_ = u;
    }
  }
  return literals_local._4_4_;
}

Assistant:

static U32 ZSTD_rawLiteralsCost(const BYTE* const literals, U32 const litLength,
                                const optState_t* const optPtr,
                                int optLevel)
{
    if (litLength == 0) return 0;

    if (!ZSTD_compressedLiterals(optPtr))
        return (litLength << 3) * BITCOST_MULTIPLIER;  /* Uncompressed - 8 bytes per literal. */

    if (optPtr->priceType == zop_predef)
        return (litLength*6) * BITCOST_MULTIPLIER;  /* 6 bit per literal - no statistic used */

    /* dynamic statistics */
    {   U32 price = optPtr->litSumBasePrice * litLength;
        U32 const litPriceMax = optPtr->litSumBasePrice - BITCOST_MULTIPLIER;
        U32 u;
        assert(optPtr->litSumBasePrice >= BITCOST_MULTIPLIER);
        for (u=0; u < litLength; u++) {
            U32 litPrice = WEIGHT(optPtr->litFreq[literals[u]], optLevel);
            if (UNLIKELY(litPrice > litPriceMax)) litPrice = litPriceMax;
            price -= litPrice;
        }
        return price;
    }
}